

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O1

Entity * Entity::from_json(Json *json,Map *map,World *world)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppEVar2;
  char cVar3;
  Map *pMVar4;
  bool bVar5;
  Position PVar6;
  const_reference pvVar7;
  EntityType *pEVar8;
  reference json_00;
  Entity *this;
  ulong uVar9;
  bool ret_12;
  const_iterator __begin2;
  bool ret_13;
  bool ret_7;
  bool ret_6;
  bool ret_5;
  bool ret_4;
  bool ret_3;
  uchar ret_2;
  uchar ret_1;
  uchar ret;
  bool ret_11;
  bool ret_10;
  unsigned_short ret_9;
  bool ret_8;
  boolean_t local_2f2;
  uchar local_2f1;
  string local_2f0;
  key_type local_2d0;
  uint8_t local_2b0;
  undefined4 uStack_2af;
  undefined2 uStack_2ab;
  uint8_t uStack_2a9;
  undefined1 uStack_2a8;
  undefined1 uStack_2a7;
  undefined1 uStack_2a6;
  undefined1 uStack_2a5;
  undefined1 uStack_2a4;
  undefined1 uStack_2a3;
  undefined1 uStack_2a2;
  bool bStack_2a1;
  uchar local_2a0;
  undefined1 uStack_29f;
  undefined2 uStack_29e;
  undefined4 uStack_29c;
  Entity *pEStack_298;
  vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_> vStack_290;
  undefined **local_278;
  uint16_t local_270;
  uint8_t local_26e;
  undefined1 local_268;
  bool bStack_267;
  undefined1 local_266;
  key_type local_260;
  key_type local_240;
  key_type local_220;
  key_type local_200;
  key_type local_1e0;
  key_type local_1c0;
  key_type local_1a0;
  key_type local_180;
  key_type local_160;
  Map *local_140;
  key_type local_138;
  key_type local_118;
  key_type local_f8;
  key_type local_d8;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_b8;
  key_type local_a8;
  Attributes local_88;
  
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"entityType","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_2d0);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_2f0,pvVar7);
  pEVar8 = World::entity_type(world,&local_2f0);
  local_2b0 = pEVar8->_id;
  local_b8.m_type = null;
  local_b8.m_value.object = (object_t *)0x0;
  nlohmann::detail::external_constructor<(nlohmann::detail::value_t)3>::
  construct<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_char[9],_0>
            (&local_b8,(char (*) [9])"position");
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::assert_invariant(&local_b8,true);
  PVar6 = Position::from_json(&local_b8);
  uStack_2af = PVar6._0_4_;
  uStack_2ab = PVar6._4_2_;
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"orientation","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_160);
  local_180._M_dataplus._M_p = local_180._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
            (pvVar7,(uchar *)&local_180);
  uStack_2a9 = (uint8_t)local_180._M_dataplus._M_p;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"palette","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_180);
  local_1a0._M_dataplus._M_p = local_1a0._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
            (pvVar7,(uchar *)&local_1a0);
  uStack_2a8 = local_1a0._M_dataplus._M_p._0_1_;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"speed","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_1a0);
  local_1c0._M_dataplus._M_p = local_1c0._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
            (pvVar7,(uchar *)&local_1c0);
  uStack_2a7 = local_1c0._M_dataplus._M_p._0_1_;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"fightable","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_1c0);
  local_1e0._M_dataplus._M_p = local_1e0._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar7,(boolean_t *)&local_1e0);
  uStack_2a6 = local_1e0._M_dataplus._M_p._0_1_;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"liftable","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_1e0);
  local_200._M_dataplus._M_p = local_200._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar7,(boolean_t *)&local_200);
  uStack_2a5 = local_200._M_dataplus._M_p._0_1_;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"canPassThrough","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_200);
  local_220._M_dataplus._M_p = local_220._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar7,(boolean_t *)&local_220);
  uStack_2a4 = local_220._M_dataplus._M_p._0_1_;
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_220,"appearAfterPlayerMovedAway","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_220);
  local_240._M_dataplus._M_p = local_240._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar7,(boolean_t *)&local_240);
  uStack_2a3 = local_240._M_dataplus._M_p._0_1_;
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"gravityImmune","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_240);
  local_260._M_dataplus._M_p = local_260._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar7,(boolean_t *)&local_260);
  uStack_2a2 = local_260._M_dataplus._M_p._0_1_;
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"talkable","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_260);
  local_d8._M_dataplus._M_p = local_d8._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar7,(boolean_t *)&local_d8);
  bStack_2a1 = (bool)local_d8._M_dataplus._M_p._0_1_;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"dialogue","");
  local_2f1 = '\0';
  local_2a0 = nlohmann::
              basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::value<unsigned_char,_0>(json,&local_d8,&local_2f1);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"behaviorId","");
  local_140 = map;
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_a8);
  local_f8._M_dataplus._M_p = local_f8._M_dataplus._M_p & 0xffffffffffff0000;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_short,_0>
            (pvVar7,(unsigned_short *)&local_f8);
  uStack_29e = local_f8._M_dataplus._M_p._0_2_;
  pEStack_298 = (Entity *)0x0;
  vStack_290.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_290.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_290.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_278 = &PTR_to_json_abi_cxx11__00261860;
  local_270 = 0xff;
  local_26e = 0xff;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"flagUnknown_2_3","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_f8);
  local_118._M_dataplus._M_p = local_118._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar7,(boolean_t *)&local_118);
  _local_268 = CONCAT11(bStack_267,local_118._M_dataplus._M_p._0_1_);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"flagUnknown_2_4","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_118);
  local_138._M_dataplus._M_p = local_138._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar7,(boolean_t *)&local_138);
  bStack_267 = local_138._M_dataplus._M_p._0_1_;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"flagUnknown_3_5","");
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_138);
  local_2f2 = false;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar7,&local_2f2);
  local_266 = local_2f2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json(&local_b8);
  paVar1 = &local_2f0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  local_2f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"useTilesFromOtherEntity","")
  ;
  pvVar7 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_2f0);
  local_2d0._M_dataplus._M_p = local_2d0._M_dataplus._M_p & 0xffffffffffffff00;
  nlohmann::detail::
  from_json<nlohmann::basic_json<nlohmann::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (pvVar7,(boolean_t *)&local_2d0);
  cVar3 = (char)local_2d0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  pMVar4 = local_140;
  if (cVar3 != '\0') {
    local_2f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2f0,"entityIdToUseTilesFrom","");
    pvVar7 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_2f0);
    local_2d0._M_dataplus._M_p = local_2d0._M_dataplus._M_p & 0xffffffffffffff00;
    nlohmann::detail::
    from_json<nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char,_0>
              (pvVar7,(uchar *)&local_2d0);
    uVar9 = (ulong)local_2d0._M_dataplus._M_p & 0xff;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    ppEVar2 = (pMVar4->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(pMVar4->_entities).super__Vector_base<Entity_*,_std::allocator<Entity_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3) <= uVar9) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar9);
    }
    pEStack_298 = ppEVar2[uVar9];
  }
  bVar5 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::contains<const_char_(&)[10],_0>(json,(char (*) [10])"maskFlags");
  if (bVar5) {
    local_2f0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"maskFlags","");
    pvVar7 = nlohmann::
             basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::at(json,&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cbegin((const_iterator *)&local_2f0,pvVar7);
    nlohmann::
    basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::cend((const_iterator *)&local_2d0,pvVar7);
    while( true ) {
      bVar5 = nlohmann::detail::
              iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::
              operator==<nlohmann::detail::iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_nullptr>
                        ((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&local_2f0,
                         (iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          *)&local_2d0);
      if (bVar5) break;
      json_00 = nlohmann::detail::
                iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator*((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)&local_2f0);
      EntityMaskFlag::from_json((EntityMaskFlag *)&local_160,json_00);
      std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::emplace_back<EntityMaskFlag>
                (&vStack_290,(EntityMaskFlag *)&local_160);
      nlohmann::detail::
      iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator++((iter_impl<const_nlohmann::basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)&local_2f0);
    }
  }
  this = (Entity *)operator_new(0x58);
  local_88.position.x = (undefined1)uStack_2af;
  local_88.position.y = uStack_2af._1_1_;
  local_88.position.z = uStack_2af._2_1_;
  local_88.position.half_x = (bool)uStack_2af._3_1_;
  local_88.type_id = local_2b0;
  local_88.position.half_y = (bool)(undefined1)uStack_2ab;
  local_88.position.half_z = (bool)uStack_2ab._1_1_;
  local_88.orientation = uStack_2a9;
  local_88.speed = uStack_2a7;
  local_88.palette = uStack_2a8;
  local_88.fightable = (bool)uStack_2a6;
  local_88.liftable = (bool)uStack_2a5;
  local_88.can_pass_through = (bool)uStack_2a4;
  local_88.appear_after_player_moved_away = (bool)uStack_2a3;
  local_88.gravity_immune = (bool)uStack_2a2;
  local_88.talkable = bStack_2a1;
  local_88._17_1_ = uStack_29f;
  local_88.dialogue = local_2a0;
  local_88.behavior_id = uStack_29e;
  local_88._20_4_ = uStack_29c;
  local_88.entity_to_use_tiles_from = pEStack_298;
  std::vector<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>::vector
            (&local_88.mask_flags,&vStack_290);
  local_88.persistence_flag._vptr_Flag = (_func_int **)&PTR_to_json_abi_cxx11__00261860;
  local_88.persistence_flag.byte = local_270;
  local_88.persistence_flag.bit = local_26e;
  local_88.flag_unknown_2_3 = local_268;
  local_88.flag_unknown_2_4 = bStack_267;
  local_88.flag_unknown_3_5 = (bool)local_266;
  Entity(this,&local_88);
  if (local_88.mask_flags.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.mask_flags.
                    super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.mask_flags.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  this->_map = pMVar4;
  if (vStack_290.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vStack_290.super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vStack_290.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_290.
                          super__Vector_base<EntityMaskFlag,_std::allocator<EntityMaskFlag>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return this;
}

Assistant:

Entity* Entity::from_json(const Json& json, Map* map, const World& world)
{
    Attributes attrs {
        .type_id = world.entity_type((std::string)json.at("entityType"))->id(),

        .position = Position::from_json("position"),
        .orientation = json.at("orientation"),
        .palette = json.at("palette"),
        .speed = json.at("speed"),

        .fightable = json.at("fightable"),
        .liftable = json.at("liftable"),
        .can_pass_through = json.at("canPassThrough"),
        .appear_after_player_moved_away = json.at("appearAfterPlayerMovedAway"),
        .gravity_immune = json.at("gravityImmune"),

        .talkable = json.at("talkable"),
        .dialogue = json.value<uint8_t>("dialogue", 0),

        .behavior_id = json.at("behaviorId"),

        .flag_unknown_2_3 = json.at("flagUnknown_2_3"),
        .flag_unknown_2_4 = json.at("flagUnknown_2_4"),
        .flag_unknown_3_5 = json.at("flagUnknown_3_5"),
    };

    bool use_tiles_from_other_entity = json.at("useTilesFromOtherEntity");
    if(use_tiles_from_other_entity)
    {
        uint8_t entity_id_to_use_tiles_from = json.at("entityIdToUseTilesFrom");
        attrs.entity_to_use_tiles_from = map->entity(entity_id_to_use_tiles_from);
    }

    if(json.contains("maskFlags"))
    {
        for(const Json& j : json.at("maskFlags"))
            attrs.mask_flags.emplace_back(EntityMaskFlag::from_json(j));
    }

    Entity* entity = new Entity(attrs);
    entity->_map = map;

    return entity;
}